

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::UniformType::streamArrayStr
          (UniformType *this,ostringstream *_str,int arrayElem)

{
  pointer piVar1;
  int iVar2;
  ostream *poVar3;
  pointer piVar4;
  int iVar5;
  ulong uVar6;
  
  if (this->isArray == true) {
    piVar4 = (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (arrayElem < 0) {
      if (piVar1 != piVar4) {
        uVar6 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&_str->super_basic_ostream<char,_std::char_traits<char>_>,"[",1);
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             (_str,(this->arraySizesSegmented).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar6]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)((long)(this->arraySizesSegmented).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)(this->arraySizesSegmented).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 2));
      }
    }
    else if (piVar1 != piVar4) {
      iVar2 = this->arraySize;
      uVar6 = 0;
      do {
        iVar2 = iVar2 / piVar4[uVar6];
        std::__ostream_insert<char,std::char_traits<char>>
                  (&_str->super_basic_ostream<char,_std::char_traits<char>_>,"[",1);
        iVar5 = arrayElem / iVar2;
        arrayElem = arrayElem % iVar2;
        poVar3 = (ostream *)std::ostream::operator<<(_str,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
        uVar6 = uVar6 + 1;
        piVar4 = (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(this->arraySizesSegmented).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar4 >> 2));
    }
  }
  return;
}

Assistant:

void streamArrayStr(std::ostringstream& _str, int arrayElem = -1) const
	{
		if (!isArray)
		{
			return;
		}
		if (arrayElem < 0)
		{
			for (size_t segment = 0; segment < arraySizesSegmented.size(); segment++)
			{
				_str << "[" << arraySizesSegmented[segment] << "]";
			}
		}
		else
		{
			int tailSize = arraySize;
			for (size_t segment = 0; segment < arraySizesSegmented.size(); segment++)
			{
				tailSize /= arraySizesSegmented[segment];
				_str << "[" << arrayElem / tailSize << "]";
				arrayElem %= tailSize;
			}
		}
	}